

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

lua_Integer lua_tointegerx(lua_State *L,int idx,int *pisnum)

{
  TValue *obj;
  int local_38;
  int isnum;
  TValue *o;
  lua_Integer res;
  int *pisnum_local;
  lua_State *plStack_10;
  int idx_local;
  lua_State *L_local;
  
  o = (TValue *)0x0;
  res = (lua_Integer)pisnum;
  pisnum_local._4_4_ = idx;
  plStack_10 = L;
  obj = index2value(L,idx);
  if (obj->tt_ == '\x03') {
    o = (TValue *)(obj->value_).gc;
    local_38 = 1;
  }
  else {
    local_38 = luaV_tointeger(obj,(lua_Integer *)&o,F2Ieq);
  }
  if (res != 0) {
    *(int *)res = local_38;
  }
  return (lua_Integer)o;
}

Assistant:

LUA_API lua_Integer lua_tointegerx (lua_State *L, int idx, int *pisnum) {
  lua_Integer res = 0;
  const TValue *o = index2value(L, idx);
  int isnum = tointeger(o, &res);
  if (pisnum)
    *pisnum = isnum;
  return res;
}